

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O2

date_t __thiscall
duckdb::TimeBucket::WidthConvertibleToMicrosBinaryOperator::
Operation<duckdb::interval_t,duckdb::date_t,duckdb::date_t>
          (WidthConvertibleToMicrosBinaryOperator *this,interval_t bucket_width,date_t ts)

{
  bool bVar1;
  date_t dVar2;
  int64_t bucket_width_micros;
  timestamp_t tVar3;
  int64_t ts_micros;
  WidthConvertibleToMicrosBinaryOperator *local_20;
  int64_t local_18;
  
  local_18 = bucket_width._0_8_;
  dVar2.days = bucket_width.micros._0_4_;
  local_20 = this;
  bVar1 = Value::IsFinite<duckdb::date_t>(dVar2);
  if (bVar1) {
    bucket_width_micros = Interval::GetMicro((interval_t *)&local_20);
    tVar3 = Cast::Operation<duckdb::date_t,duckdb::timestamp_t>(dVar2);
    ts_micros = Timestamp::GetEpochMicroSeconds(tVar3);
    tVar3 = WidthConvertibleToMicrosCommon(bucket_width_micros,ts_micros,0x35d2976e6a000);
    dVar2 = Cast::Operation<duckdb::timestamp_t,duckdb::date_t>(tVar3);
    return (date_t)dVar2.days;
  }
  dVar2 = Cast::Operation<duckdb::date_t,duckdb::date_t>(dVar2);
  return (date_t)dVar2.days;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS));
		}